

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_test.cc
# Opt level: O2

void __thiscall
sample_after_nomalizing_degenerate::test_method(sample_after_nomalizing_degenerate *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  int scode;
  uint32_t chosen_index;
  vector<float,_std::allocator<float>_> pdf;
  undefined4 local_84;
  vector<float,_std::allocator<float>_> expected;
  undefined **local_68;
  ulong uStack_60;
  undefined8 *local_58;
  char *local_50;
  char *local_40;
  char *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_20;
  char *local_18;
  
  local_68 = (undefined **)0x0;
  uStack_60 = 0;
  local_58 = (undefined8 *)((ulong)local_58 & 0xffffffff00000000);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_68;
  std::vector<float,_std::allocator<float>_>::vector(&pdf,__l,(allocator_type *)&expected);
  local_68 = (undefined **)0x3f800000;
  uStack_60 = 0;
  local_58 = (undefined8 *)((ulong)local_58 & 0xffffffff00000000);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_68;
  std::vector<float,_std::allocator<float>_>::vector
            (&expected,__l_00,(allocator_type *)&chosen_index);
  scode = exploration::
          sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (0x1e6f,pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                     pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&chosen_index);
  local_20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_18 = "";
  local_30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_28 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_20,0x2d);
  uStack_60 = uStack_60 & 0xffffffffffffff00;
  local_68 = &PTR__lazy_ostream_002e5760;
  local_58 = &boost::unit_test::lazy_ostream::inst;
  local_50 = "";
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_38 = "";
  local_84 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_68,&local_40,0x2d,1,2,&scode,"scode",&local_84,"0");
  check_float_vectors(&pdf,&expected,0.0001);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&expected.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&pdf.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sample_after_nomalizing_degenerate) {
  std::vector<float> pdf = { 0.0f, 0.0f, 0.0f, 0.0f, 0.0f };
  const std::vector<float> expected = { 1.0f, 0.0f, 0.0f, 0.0f, 0.0f };
  uint32_t chosen_index;

  const auto scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);
}